

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_nextInputSizeHint(ZSTD_CCtx *cctx)

{
  long in_RDI;
  size_t hintInSize;
  size_t local_18;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0x15c) == 1) {
    local_8 = *(long *)(in_RDI + 0x2d8) - *(long *)(in_RDI + 0xe20);
  }
  else {
    if (*(int *)(in_RDI + 0x15c) != 0) {
      __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_buffered",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6796,"size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx *)");
    }
    local_18 = *(long *)(in_RDI + 0xdd8) - *(long *)(in_RDI + 0xdd0);
    if (local_18 == 0) {
      local_18 = *(size_t *)(in_RDI + 0x2d8);
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx* cctx)
{
    if (cctx->appliedParams.inBufferMode == ZSTD_bm_stable) {
        return cctx->blockSize - cctx->stableIn_notConsumed;
    }
    assert(cctx->appliedParams.inBufferMode == ZSTD_bm_buffered);
    {   size_t hintInSize = cctx->inBuffTarget - cctx->inBuffPos;
        if (hintInSize==0) hintInSize = cctx->blockSize;
        return hintInSize;
    }
}